

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1fffe::TestAddingSecondTestAddsItToEndOfList::
~TestAddingSecondTestAddsItToEndOfList(TestAddingSecondTestAddsItToEndOfList *this)

{
  TestAddingSecondTestAddsItToEndOfList *this_local;
  
  ~TestAddingSecondTestAddsItToEndOfList(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST (AddingSecondTestAddsItToEndOfList)
{
    Test test1("test1");
    Test test2("test2");

    TestList list;
    list.Add(&test1);
    list.Add(&test2);

    CHECK (list.GetHead() == &test1);
    CHECK (test1.next == &test2);
    CHECK (test2.next == 0);
}